

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O2

void Amap_ManMatchNode(Amap_Man_t *p,Amap_Obj_t *pNode,int fFlow,int fRefs)

{
  float fVar1;
  Vec_Ptr_t *vTemp;
  Amap_Cut_t *pAVar2;
  int iVar3;
  Amap_Cut_t AVar4;
  ulong uVar5;
  Amap_Gat_t *pAVar6;
  Amap_Obj_t *pAVar7;
  int *piVar8;
  Amap_Cut_t **ppAVar9;
  Amap_Cut_t *pAVar10;
  uint uVar11;
  int iVar12;
  Amap_Set_t *pAVar13;
  ulong uVar14;
  float fVar15;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar17;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Dd_00;
  float fVar19;
  float fVar20;
  Amap_Mat_t local_a8;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  Amap_Cut_t *local_78;
  Amap_Set_t *pAStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  Amap_Cut_t *local_58;
  Amap_Set_t *pAStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  ulong local_38;
  
  pAStack_50 = (Amap_Set_t *)0x0;
  uStack_48._0_4_ = 0.0;
  uStack_48._4_4_ = 0.0;
  uStack_40._0_4_ = 0.0;
  uStack_40._4_4_ = 0;
  pAStack_70 = (Amap_Set_t *)0x0;
  uStack_68._0_4_ = 0.0;
  uStack_68._4_4_ = 0.0;
  uStack_60._0_4_ = 0.0;
  uStack_60._4_4_ = 0;
  if (fRefs == 0) {
    pNode->EstRefs = (float)pNode->nRefs;
  }
  else {
    iVar3 = pNode->nFouts[1] + pNode->nFouts[0];
    pNode->EstRefs = (pNode->EstRefs + pNode->EstRefs + (float)iVar3) / 3.0;
    if (0 < iVar3) {
      Amap_CutAreaDeref(p,&pNode->Best);
    }
  }
  local_78 = (Amap_Cut_t *)0x0;
  local_58 = (Amap_Cut_t *)0x0;
  pAVar10 = (Amap_Cut_t *)(pNode->field_11).pData;
  uVar5 = 0;
  do {
    if ((int)pNode->nCuts <= (int)uVar5) {
      fVar20 = (float)uStack_48 - (float)uStack_68;
      fVar19 = -fVar20;
      if (-fVar20 <= fVar20) {
        fVar19 = fVar20;
      }
      fVar15 = (float)uStack_40 - (float)uStack_60;
      fVar20 = -fVar15;
      if (-fVar15 <= fVar15) {
        fVar20 = fVar15;
      }
      ppAVar9 = &local_58;
      if (fVar19 / (float)uStack_68 < (fVar20 * p->pPars->fADratio) / (float)uStack_40) {
        ppAVar9 = &local_78;
      }
      *(ulong *)pNode =
           *(ulong *)pNode & 0x7fffffffffffffff |
           (ulong)(((uint)ppAVar9[1][2] ^ (uint)**ppAVar9) >> 0x10) << 0x3f;
      pAVar13 = (Amap_Set_t *)ppAVar9[1];
      pAVar10 = ppAVar9[2];
      pAVar2 = ppAVar9[3];
      (pNode->Best).pCut = *ppAVar9;
      (pNode->Best).pSet = pAVar13;
      *(Amap_Cut_t **)&(pNode->Best).Area = pAVar10;
      *(Amap_Cut_t **)&(pNode->Best).Delay = pAVar2;
      pAVar10 = Amap_ManDupCut(p,(pNode->Best).pCut);
      (pNode->Best).pCut = pAVar10;
      if ((fRefs != 0) &&
         (iVar3 = pNode->nFouts[1] + pNode->nFouts[0],
         iVar3 != 0 && SCARRY4(pNode->nFouts[1],pNode->nFouts[0]) == iVar3 < 0)) {
        Amap_CutAreaRef(p,&pNode->Best);
        return;
      }
      return;
    }
    local_38 = uVar5;
    AVar4 = *pAVar10;
    uVar5 = (ulong)(uint)AVar4;
    if (((uint)AVar4 & 0xffff) != 0) {
      pAVar13 = (Amap_Set_t *)&p->pLib->pNodes[uVar5 & 0xffff].pSets;
LAB_0039c6ed:
      AVar4 = SUB84(uVar5,0);
      pAVar13 = pAVar13->pNext;
      if (pAVar13 != (Amap_Set_t *)0x0) {
        local_a8.Area = 0.0;
        local_a8.AveFan = 0.0;
        local_a8.Delay = 0.0;
        local_a8._28_4_ = 0;
        local_a8.pCut = pAVar10;
        local_a8.pSet = pAVar13;
        pAVar6 = Amap_LibGate(p->pLib,(uint)*(ushort *)&pAVar13->field_0x8);
        uVar5 = (ulong)(uint)*pAVar10;
        uVar11 = (uint)*pAVar10 >> 0x11;
        if (fFlow == 0) {
          if ((byte)pAVar6->field_0x3b != uVar11) {
            __assert_fail("pGate->nPins == pM->pCut->nFans",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapMatch.c"
                          ,0x1ec,
                          "void Amap_ManMatchGetExacts(Amap_Man_t *, Amap_Obj_t *, Amap_Mat_t *)");
          }
          fVar20 = 0.0;
          fVar19 = 0.0;
          for (uVar14 = 0; uVar14 < uVar5 >> 0x11; uVar14 = uVar14 + 1) {
            uVar11 = Abc_Lit2Var((int)pAVar13->Ins[uVar14]);
            iVar3 = Abc_Lit2Var((int)pAVar10[(ulong)uVar11 + 1]);
            pAVar7 = Amap_ManObj(p,iVar3);
            iVar12 = (int)(pAVar7->Best).Delay;
            iVar3 = (int)fVar20;
            if ((int)fVar20 <= iVar12) {
              iVar3 = iVar12;
            }
            fVar20 = (float)iVar3;
            fVar19 = fVar19 + (float)(pAVar7->nFouts[1] + pAVar7->nFouts[0]);
            uVar5 = (ulong)(uint)*pAVar10;
          }
          fVar19 = fVar19 / (float)(byte)pAVar6->field_0x3b;
          local_a8.AveFan = fVar19;
          fVar20 = fVar20 + 1.0;
          local_a8.Delay = fVar20;
          vTemp = p->vTempP;
          vTemp->nSize = 0;
          local_88 = Amap_CutAreaRef2(p,&local_a8,vTemp,8);
          uStack_84 = extraout_XMM0_Db_00;
          uStack_80 = extraout_XMM0_Dc_00;
          uStack_7c = extraout_XMM0_Dd_00;
          for (iVar3 = 0; iVar3 < p->vTempP->nSize; iVar3 = iVar3 + 1) {
            piVar8 = (int *)Vec_PtrEntry(p->vTempP,iVar3);
            *piVar8 = *piVar8 + -1;
          }
          uVar5 = (ulong)(uint)*pAVar10;
          uVar11 = (*(uint *)&pAVar13->field_0x8 ^ (uint)*pAVar10) >> 0x10 & 1;
          fVar15 = local_88;
          if ((pNode->nFouts[uVar11] == 0) && (0 < pNode->nFouts[uVar11 ^ 1])) {
            fVar15 = local_88 + p->fAreaInv;
          }
          local_a8.Area = fVar15;
        }
        else {
          if ((byte)pAVar6->field_0x3b != uVar11) {
            __assert_fail("pGate->nPins == pM->pCut->nFans",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapMatch.c"
                          ,0x1c2,"void Amap_ManMatchGetFlows(Amap_Man_t *, Amap_Mat_t *)");
          }
          fVar15 = (float)pAVar6->dArea;
          fVar20 = 0.0;
          fVar19 = 0.0;
          uVar16 = extraout_XMM0_Db;
          uVar17 = extraout_XMM0_Dc;
          uVar18 = extraout_XMM0_Dd;
          for (uVar14 = 0; uVar14 < uVar5 >> 0x11; uVar14 = uVar14 + 1) {
            local_88 = fVar15;
            uStack_84 = uVar16;
            uStack_80 = uVar17;
            uStack_7c = uVar18;
            uVar11 = Abc_Lit2Var((int)pAVar13->Ins[uVar14]);
            iVar3 = Abc_Lit2Var((int)pAVar10[(ulong)uVar11 + 1]);
            pAVar7 = Amap_ManObj(p,iVar3);
            iVar3 = (int)(pAVar7->Best).Delay;
            if (iVar3 < (int)fVar20) {
              iVar3 = (int)fVar20;
            }
            fVar20 = (pAVar7->Best).Area;
            iVar12 = pAVar7->nFouts[1] + pAVar7->nFouts[0];
            if (iVar12 != 0) {
              fVar20 = fVar20 / pAVar7->EstRefs;
            }
            fVar15 = 1e+32;
            if (local_88 < 1e+32 && fVar20 < 1e+32) {
              fVar15 = fVar20 + local_88;
            }
            uVar18 = 0;
            uVar17 = 0;
            uVar16 = 0;
            fVar20 = (float)iVar3;
            fVar19 = fVar19 + (float)iVar12;
            uVar5 = (ulong)(uint)*pAVar10;
          }
          fVar19 = fVar19 / (float)(byte)pAVar6->field_0x3b;
          local_a8.AveFan = fVar19;
          local_a8.Area = fVar15;
          fVar20 = fVar20 + 1.0;
          local_a8.Delay = fVar20;
        }
        if (local_78 == (Amap_Cut_t *)0x0) {
LAB_0039c986:
          uStack_68._0_4_ = local_a8.Area;
          uStack_68._4_4_ = local_a8.AveFan;
          uStack_60._0_4_ = local_a8.Delay;
          uStack_60._4_4_ = local_a8._28_4_;
          local_78 = local_a8.pCut;
          pAStack_70 = local_a8.pSet;
        }
        else {
          fVar1 = p->pPars->fEpsilon;
          if ((fVar20 - fVar1 <= (float)uStack_60) &&
             ((fVar20 + fVar1 < (float)uStack_60 ||
              ((fVar15 - fVar1 <= (float)uStack_68 &&
               ((fVar1 + fVar15 < (float)uStack_68 || (uStack_68._4_4_ <= fVar19 - fVar1))))))))
          goto LAB_0039c986;
        }
        if (local_58 != (Amap_Cut_t *)0x0) break;
        goto LAB_0039c9cc;
      }
    }
    uVar5 = (ulong)((int)local_38 + 1);
    pAVar10 = pAVar10 + (ulong)((uint)AVar4 >> 0x11) + 1;
  } while( true );
  fVar1 = p->pPars->fEpsilon;
  if ((fVar15 - fVar1 <= (float)uStack_48) &&
     ((fVar15 + fVar1 < (float)uStack_48 ||
      ((uStack_48._4_4_ <= fVar19 - fVar1 &&
       ((uStack_48._4_4_ < fVar19 + fVar1 || (fVar20 - fVar1 <= (float)uStack_40)))))))) {
LAB_0039c9cc:
    uStack_48._0_4_ = local_a8.Area;
    uStack_48._4_4_ = local_a8.AveFan;
    uStack_40._0_4_ = local_a8.Delay;
    uStack_40._4_4_ = local_a8._28_4_;
    local_58 = local_a8.pCut;
    pAStack_50 = local_a8.pSet;
  }
  goto LAB_0039c6ed;
}

Assistant:

void Amap_ManMatchNode( Amap_Man_t * p, Amap_Obj_t * pNode, int fFlow, int fRefs )
{
    int fVerbose = 0; //(pNode->Level == 2 || pNode->Level == 4);
    int fVeryVerbose = fVerbose;

    Amap_Mat_t MA = {0}, MD = {0}, M = {0};
    Amap_Mat_t * pMBestA = &MA, * pMBestD = &MD, * pMThis = &M, * pMBest;
    Amap_Cut_t * pCut;
    Amap_Set_t * pSet;
    Amap_Nod_t * pNod;
    int i;

    if ( fRefs )
        pNode->EstRefs = (float)((2.0 * pNode->EstRefs + Amap_ObjRefsTotal(pNode)) / 3.0);
    else
        pNode->EstRefs = (float)pNode->nRefs;
    if ( fRefs && Amap_ObjRefsTotal(pNode) > 0 )
        Amap_CutAreaDeref( p, &pNode->Best );

    if ( fVerbose )
        printf( "\nNode %d (%d)\n", pNode->Id, pNode->Level );

    pMBestA->pCut = pMBestD->pCut = NULL;
    Amap_NodeForEachCut( pNode, pCut, i )
    {
        if ( pCut->iMat == 0 )
            continue;
        pNod = Amap_LibNod( p->pLib, pCut->iMat );
        Amap_LibNodeForEachSet( pNod, pSet )
        {
            Amap_ManMatchStart( pMThis, pCut, pSet );
            if ( fFlow )
                Amap_ManMatchGetFlows( p, pMThis );
            else
                Amap_ManMatchGetExacts( p, pNode, pMThis );
            if ( pMBestD->pCut == NULL || Amap_CutCompareDelay(p, pMBestD, pMThis) == 1 )
                *pMBestD = *pMThis;
            if ( pMBestA->pCut == NULL || Amap_CutCompareArea(p, pMBestA, pMThis) == 1 )
                *pMBestA = *pMThis;

            if ( fVeryVerbose ) 
            {
                printf( "Cut %2d (%d) :  ", i, pCut->nFans );
                printf( "Gate %10s  ",      Amap_LibGate(p->pLib, pMThis->pSet->iGate)->pName );
                printf( "%s  ",             pMThis->pSet->fInv ? "inv" : "   " );
                printf( "Delay %5.2f  ",    pMThis->Delay );
                printf( "Area %5.2f  ",     pMThis->Area );
                printf( "\n" );
            }
        }
    }

    if ( Abc_AbsFloat(pMBestA->Area - pMBestD->Area) / pMBestD->Area >= p->pPars->fADratio * Abc_AbsFloat(pMBestA->Delay - pMBestD->Delay) / pMBestA->Delay )
        pMBest = pMBestA;
    else
        pMBest = pMBestD;

    if ( fVerbose )
    {
        printf( "BEST MATCHA:  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBestA->pSet->iGate)->pName );
        printf( "%s  ",           pMBestA->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBestA->Delay );
        printf( "Area %5.2f  ",   pMBestA->Area );
        printf( "\n" ); 

        printf( "BEST MATCHD:  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBestD->pSet->iGate)->pName );
        printf( "%s  ",           pMBestD->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBestD->Delay );
        printf( "Area %5.2f  ",   pMBestD->Area );
        printf( "\n" ); 

        printf( "BEST MATCH :  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBest->pSet->iGate)->pName );
        printf( "%s  ",           pMBest->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBest->Delay );
        printf( "Area %5.2f  ",   pMBest->Area );
        printf( "\n" ); 
    }

    pNode->fPolar = pMBest->pCut->fInv ^ pMBest->pSet->fInv;
    pNode->Best = *pMBest;
    pNode->Best.pCut = Amap_ManDupCut( p, pNode->Best.pCut );
    if ( fRefs && Amap_ObjRefsTotal(pNode) > 0 )
        Amap_CutAreaRef( p, &pNode->Best );
}